

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# share.c
# Opt level: O0

CURLSH * curl_share_init(void)

{
  int iVar1;
  Curl_share *share;
  
  share = (Curl_share *)(*Curl_ccalloc)(1,200);
  if (share != (Curl_share *)0x0) {
    share->specifier = share->specifier | 2;
    iVar1 = Curl_mk_dnscache(&share->hostcache);
    if (iVar1 != 0) {
      (*Curl_cfree)(share);
      share = (Curl_share *)0x0;
    }
  }
  return share;
}

Assistant:

struct Curl_share *
curl_share_init(void)
{
  struct Curl_share *share = calloc(1, sizeof(struct Curl_share));
  if(share) {
    share->specifier |= (1<<CURL_LOCK_DATA_SHARE);

    if(Curl_mk_dnscache(&share->hostcache)) {
      free(share);
      return NULL;
    }
  }

  return share;
}